

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  GREG *G_00;
  Node *pNStack_28;
  int c;
  Node *n;
  GREG *G;
  char **argv_local;
  int argc_local;
  
  output = _stdout;
  input = _stdin;
  lineNumber = 1;
  fileName = "<stdin>";
  do {
    iVar1 = getopt(argc,argv,"Vho:v");
    if (iVar1 == -1) {
      argv_local._0_4_ = argc - _optind;
      G = (GREG *)(argv + _optind);
      G_00 = yyparse_new((void *)0x0);
      if ((int)argv_local == 0) {
        iVar1 = yyparse(G_00);
        if (iVar1 == 0) {
          yyerror(G_00,"syntax error");
        }
      }
      else {
        for (; (int)argv_local != 0; argv_local._0_4_ = (int)argv_local + -1) {
          iVar1 = strcmp(G->buf,"-");
          if (iVar1 == 0) {
            input = _stdin;
            fileName = "<stdin>";
          }
          else {
            input = (FILE *)fopen(G->buf,"r");
            if ((FILE *)input == (FILE *)0x0) {
              perror(G->buf);
              exit(1);
            }
            fileName = G->buf;
          }
          lineNumber = 1;
          iVar1 = yyparse(G_00);
          if (iVar1 == 0) {
            yyerror(G_00,"syntax error");
          }
          if (input != _stdin) {
            fclose((FILE *)input);
          }
          G = (GREG *)&G->buflen;
        }
      }
      yyparse_free(G_00);
      if (verboseFlag != 0) {
        for (pNStack_28 = rules; pNStack_28 != (Node *)0x0; pNStack_28 = (pNStack_28->rule).next) {
          Rule_print(pNStack_28);
        }
      }
      Rule_compile_c_header();
      for (; headers != (Header *)0x0; headers = headers->next) {
        fprintf((FILE *)output,"%s\n",headers->text);
      }
      if (rules != (Node *)0x0) {
        Rule_compile_c(rules);
      }
      if (trailer != (char *)0x0) {
        fprintf((FILE *)output,"%s\n",trailer);
      }
      return 0;
    }
    switch(iVar1) {
    case 0x56:
      pcVar2 = __xpg_basename(*argv);
      version(pcVar2);
      exit(0);
    default:
      fprintf(_stderr,"for usage try: %s -h\n",*argv);
      exit(1);
    case 0x68:
      pcVar2 = __xpg_basename(*argv);
      usage(pcVar2);
      break;
    case 0x6f:
      output = (FILE *)fopen(_optarg,"w");
      if ((FILE *)output == (FILE *)0x0) {
        perror(_optarg);
        exit(1);
      }
      break;
    case 0x76:
      verboseFlag = verboseFlag + 1;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
  GREG *G;
  Node *n;
  int   c;

  output= stdout;
  input= stdin;
  lineNumber= 1;
  fileName= "<stdin>";

  while (-1 != (c= getopt(argc, argv, "Vho:v")))
    {
      switch (c)
	{
	case 'V':
	  version(basename(argv[0]));
	  exit(0);

	case 'h':
	  usage(basename(argv[0]));
	  break;

	case 'o':
	  if (!(output= fopen(optarg, "w")))
	    {
	      perror(optarg);
	      exit(1);
	    }
	  break;

	case 'v':
	  verboseFlag++;
	  break;

	default:
	  fprintf(stderr, "for usage try: %s -h\n", argv[0]);
	  exit(1);
	}
    }
  argc -= optind;
  argv += optind;

  G = yyparse_new(NULL);
#ifdef YY_DEBUG
  if (verboseFlag > 0) {
    G->debug = DEBUG_PARSE;
    if (verboseFlag > 1)
      G->debug = DEBUG_PARSE + DEBUG_VERBOSE;
  }
#endif
  if (argc)
    {
      for (;  argc;  --argc, ++argv)
	{
	  if (!strcmp(*argv, "-"))
	    {
	      input= stdin;
	      fileName= "<stdin>";
	    }
	  else
	    {
	      if (!(input= fopen(*argv, "r")))
		{
		  perror(*argv);
		  exit(1);
		}
	      fileName= *argv;
	    }
	  lineNumber= 1;
	  if (!yyparse(G))
	    yyerror(G, "syntax error");
	  if (input != stdin)
	    fclose(input);
	}
    }
  else
    if (!yyparse(G))
      yyerror(G, "syntax error");
  yyparse_free(G);

  if (verboseFlag)
    for (n= rules;  n;  n= n->any.next)
      Rule_print(n);

  Rule_compile_c_header();

  for (; headers;  headers= headers->next)
    fprintf(output, "%s\n", headers->text);

  if (rules)
    Rule_compile_c(rules);

  if (trailer)
    fprintf(output, "%s\n", trailer);

  return 0;
}